

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InstructionFolder::FoldScalars
          (InstructionFolder *this,Op opcode,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *operands)

{
  pointer ppCVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  undefined4 extraout_var_00;
  pointer ppCVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operand_values_in_raw_words;
  uint local_4c;
  InstructionFolder local_48;
  long *plVar5;
  
  bVar2 = IsFoldableOpcode(this,opcode);
  if (!bVar2) {
    __assert_fail("IsFoldableOpcode(opcode) && \"Unhandled instruction opcode in FoldScalars\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0xd2,
                  "uint32_t spvtools::opt::InstructionFolder::FoldScalars(spv::Op, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  local_48.folding_rules_._M_t.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>,_true,_true>
        )(__uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
          )0x0;
  local_48.context_ = (IRContext *)0x0;
  local_48.const_folding_rules_._M_t.
  super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>,_true,_true>
        )(__uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
          )0x0;
  ppCVar7 = (operands->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (operands->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppCVar7 == ppCVar1) {
      uVar4 = OperateWords(this,opcode,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
      return uVar4;
    }
    iVar3 = (*(*ppCVar7)->_vptr_Constant[0xd])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar3);
    this = &local_48;
    if (plVar5 == (long *)0x0) {
      iVar3 = (*(*ppCVar7)->_vptr_Constant[0x16])();
      if (CONCAT44(extraout_var_00,iVar3) == 0) {
        __assert_fail("false && \"FoldScalars() only accepts ScalarConst or NullConst type of \" \"constant\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                      ,0xe0,
                      "uint32_t spvtools::opt::InstructionFolder::FoldScalars(spv::Op, const std::vector<const analysis::Constant *> &) const"
                     );
      }
      local_4c = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
    }
    else {
      puVar6 = (undefined8 *)(**(code **)(*plVar5 + 0xc0))(plVar5);
      if (puVar6[1] - (long)*puVar6 != 4) {
        __assert_fail("scalar_words.size() == 1 && \"Scalar constants with longer than 32-bit width are not allowed \" \"in FoldScalars()\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                      ,0xd9,
                      "uint32_t spvtools::opt::InstructionFolder::FoldScalars(spv::Op, const std::vector<const analysis::Constant *> &) const"
                     );
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                 (value_type_conflict1 *)*puVar6);
    }
    ppCVar7 = ppCVar7 + 1;
  } while( true );
}

Assistant:

uint32_t InstructionFolder::FoldScalars(
    spv::Op opcode,
    const std::vector<const analysis::Constant*>& operands) const {
  assert(IsFoldableOpcode(opcode) &&
         "Unhandled instruction opcode in FoldScalars");
  std::vector<uint32_t> operand_values_in_raw_words;
  for (const auto& operand : operands) {
    if (const analysis::ScalarConstant* scalar = operand->AsScalarConstant()) {
      const auto& scalar_words = scalar->words();
      assert(scalar_words.size() == 1 &&
             "Scalar constants with longer than 32-bit width are not allowed "
             "in FoldScalars()");
      operand_values_in_raw_words.push_back(scalar_words.front());
    } else if (operand->AsNullConstant()) {
      operand_values_in_raw_words.push_back(0u);
    } else {
      assert(false &&
             "FoldScalars() only accepts ScalarConst or NullConst type of "
             "constant");
    }
  }
  return OperateWords(opcode, operand_values_in_raw_words);
}